

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

void fio_publish(fio_publish_args_s args)

{
  fio_str_info_s ch;
  fio_str_info_s data;
  fio_pubsub_engine_s *pfVar1;
  fio_pubsub_engine_s *pfVar2;
  fio_msg_internal_s *pfVar3;
  
  if (args.engine == (fio_pubsub_engine_s *)0x0 && args.filter != 0) {
    pfVar1 = (fio_pubsub_engine_s *)&DAT_00000001;
  }
  else {
    pfVar1 = FIO_PUBSUB_DEFAULT;
    pfVar2 = args.engine;
    if (args.engine != (fio_pubsub_engine_s *)0x0) goto LAB_0010a9b9;
  }
  pfVar2 = pfVar1;
LAB_0010a9b9:
  ch = args.channel;
  data = args.message;
  switch(pfVar2) {
  case (fio_pubsub_engine_s *)0x0:
  case (fio_pubsub_engine_s *)0x1:
    pfVar3 = fio_msg_internal_create
                       (args.filter,(uint)(args.is_json != '\0'),ch,data,args.is_json,'\x01');
    fio_send2cluster(pfVar3);
    break;
  case (fio_pubsub_engine_s *)0x2:
    pfVar3 = fio_msg_internal_create(args.filter,0,ch,data,args.is_json,'\x01');
    break;
  case (fio_pubsub_engine_s *)0x3:
    pfVar3 = fio_msg_internal_create
                       (args.filter,(uint)(args.is_json != '\0'),ch,data,args.is_json,'\x01');
    fio_send2cluster(pfVar3);
    fio_msg_internal_free(pfVar3);
    return;
  case (fio_pubsub_engine_s *)0x4:
    pfVar3 = fio_msg_internal_create
                       (args.filter,3 - (args.is_json == '\0'),ch,data,args.is_json,'\x01');
    if ((fio_data->is_worker != '\0') && (fio_data->workers != 1)) {
      fio_cluster_client_sender(pfVar3,-1);
      return;
    }
    break;
  default:
    if (args.filter == 0) {
      (*pfVar2->publish)(pfVar2,ch,data,args.is_json);
    }
    else if (1 < FIO_LOG_LEVEL) {
      FIO_LOG2STDERR(
                    "ERROR: (pub/sub) pub/sub engines can only be used for pub/sub messages (no filter)."
                    );
      return;
    }
    return;
  }
  fio_publish2process(pfVar3);
  return;
}

Assistant:

void fio_publish FIO_IGNORE_MACRO(fio_publish_args_s args) {
  if (args.filter && !args.engine) {
    args.engine = FIO_PUBSUB_CLUSTER;
  } else if (!args.engine) {
    args.engine = FIO_PUBSUB_DEFAULT;
  }
  fio_msg_internal_s *m = NULL;
  switch ((uintptr_t)args.engine) {
  case 0UL: /* fallthrough (missing default) */
  case 1UL: // ((uintptr_t)FIO_PUBSUB_CLUSTER):
    m = fio_msg_internal_create(
        args.filter,
        (args.is_json ? FIO_CLUSTER_MSG_JSON : FIO_CLUSTER_MSG_FORWARD),
        args.channel, args.message, args.is_json, 1);
    fio_send2cluster(m);
    fio_publish2process(m);
    break;
  case 2UL: // ((uintptr_t)FIO_PUBSUB_PROCESS):
    m = fio_msg_internal_create(args.filter, 0, args.channel, args.message,
                                args.is_json, 1);
    fio_publish2process(m);
    break;
  case 3UL: // ((uintptr_t)FIO_PUBSUB_SIBLINGS):
    m = fio_msg_internal_create(
        args.filter,
        (args.is_json ? FIO_CLUSTER_MSG_JSON : FIO_CLUSTER_MSG_FORWARD),
        args.channel, args.message, args.is_json, 1);
    fio_send2cluster(m);
    fio_msg_internal_free(m);
    m = NULL;
    break;
  case 4UL: // ((uintptr_t)FIO_PUBSUB_ROOT):
    m = fio_msg_internal_create(
        args.filter,
        (args.is_json ? FIO_CLUSTER_MSG_ROOT_JSON : FIO_CLUSTER_MSG_ROOT),
        args.channel, args.message, args.is_json, 1);
    if (fio_data->is_worker == 0 || fio_data->workers == 1) {
      fio_publish2process(m);
    } else {
      fio_cluster_client_sender(m, -1);
    }
    break;
  default:
    if (args.filter != 0) {
      FIO_LOG_ERROR("(pub/sub) pub/sub engines can only be used for "
                    "pub/sub messages (no filter).");
      return;
    }
    args.engine->publish(args.engine, args.channel, args.message, args.is_json);
  }
  return;
}